

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemiterator_unix.cpp
# Opt level: O2

bool __thiscall
QFileSystemIterator::advance
          (QFileSystemIterator *this,QFileSystemEntry *fileEntry,QFileSystemMetaData *metaData)

{
  Interface *pIVar1;
  long lVar2;
  bool bVar3;
  int *piVar4;
  dirent64 *pdVar5;
  size_t asize;
  QChar *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QVarLengthArray<char16_t,_256LL> buffer;
  QStringBuilder<QString_&,_QStringView_&> local_2c0;
  QArrayDataPointer<char16_t> local_2b0;
  QStringView local_298;
  QFileSystemEntry local_288;
  QVarLengthArray<char16_t,_256LL> local_250;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->dir)._M_t.super___uniq_ptr_impl<__dirstream,_QFileSystemIterator::DirStreamCloser>._M_t
      .super__Tuple_impl<0UL,___dirstream_*,_QFileSystemIterator::DirStreamCloser>.
      super__Head_base<0UL,___dirstream_*,_false>._M_head_impl == (__dirstream *)0x0) {
LAB_00377260:
    bVar3 = false;
  }
  else {
    piVar4 = __errno_location();
    do {
      *piVar4 = 0;
      pdVar5 = readdir64((DIR *)(this->dir)._M_t.
                                super___uniq_ptr_impl<__dirstream,_QFileSystemIterator::DirStreamCloser>
                                ._M_t.
                                super__Tuple_impl<0UL,___dirstream_*,_QFileSystemIterator::DirStreamCloser>
                                .super__Head_base<0UL,___dirstream_*,_false>._M_head_impl);
      this->dirEntry = (dirent64 *)pdVar5;
      if (pdVar5 == (dirent64 *)0x0) {
        this->lastError = *piVar4;
        goto LAB_00377260;
      }
      asize = strlen(pdVar5->d_name);
      memset(&local_250,0xaa,0x218);
      QVarLengthArray<char16_t,_256LL>::QVarLengthArray(&local_250,asize);
      pIVar1 = (this->toUtf16).super_QStringConverter.iface;
      if (pIVar1 == (Interface *)0x0) {
        (this->toUtf16).super_QStringConverter.state.invalidChars = 1;
        pQVar6 = (QChar *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
      }
      else {
        QVar7.m_data = pdVar5->d_name;
        QVar7.m_size = asize;
        pQVar6 = (*pIVar1->toUtf16)((QChar *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.
                                             ptr,QVar7,&(this->toUtf16).super_QStringConverter.state
                                   );
      }
      QVarLengthArray<char16_t,_256LL>::resize
                (&local_250,
                 (long)pQVar6 - (long)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr >> 1
                );
      lVar2 = (this->toUtf16).super_QStringConverter.state.invalidChars;
      if (lVar2 == 0) {
        local_298.m_size = local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s;
        local_298.m_data =
             (storage_type_conflict *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
        local_2c0.b = &local_298;
        local_2c0.a = &this->dirPath;
        QStringBuilder<QString_&,_QStringView_&>::convertTo<QString>
                  ((QString *)&local_2b0,&local_2c0);
        QFileSystemEntry::QFileSystemEntry(&local_288,&local_2b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b0);
        QFileSystemEntry::operator=(fileEntry,&local_288);
        QFileSystemEntry::~QFileSystemEntry(&local_288);
        QFileSystemMetaData::fillFromDirEnt(metaData,this->dirEntry);
      }
      else {
        *piVar4 = 0x54;
      }
      QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(&local_250);
    } while (lVar2 != 0);
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemIterator::advance(QFileSystemEntry &fileEntry, QFileSystemMetaData &metaData)
{
    auto asFileEntry = [this](QStringView name) {
#ifdef Q_OS_DARWIN
        // must match QFile::decodeName
        QString normalized = name.toString().normalized(QString::NormalizationForm_C);
        name = normalized;
#endif
        return QFileSystemEntry(dirPath + name, QFileSystemEntry::FromInternalPath());
    };
    if (!dir)
        return false;

    for (;;) {
        // From readdir man page:
        // If the end of the directory stream is reached, NULL is returned and errno is
        // not changed. If an error occurs, NULL is returned and errno is set to indicate
        // the error. To distinguish end of stream from an error, set errno to zero before
        // calling readdir() and then check the value of errno if NULL is returned.
        errno = 0;
        dirEntry = QT_READDIR(dir.get());

        if (dirEntry) {
            // POSIX allows readdir() to return a file name in struct dirent that
            // extends past the end of the d_name array (it's a char[1] array on QNX, for
            // example). Therefore, we *must* call strlen() on it to get the actual length
            // of the file name. See:
            // https://pubs.opengroup.org/onlinepubs/9699919799/basedefs/dirent.h.html#tag_13_07_05
            QByteArrayView name(dirEntry->d_name, strlen(dirEntry->d_name));
            // name.size() is sufficient here, see QUtf8::convertToUnicode() for details
            QVarLengthArray<char16_t> buffer(name.size());
            auto *end = toUtf16.appendToBuffer(buffer.data(), name);
            buffer.resize(end - buffer.constData());
            if (!toUtf16.hasError()) {
                fileEntry = asFileEntry(buffer);
                metaData.fillFromDirEnt(*dirEntry);
                return true;
            } else {
                errno = EILSEQ; // Invalid or incomplete multibyte or wide character
            }
        } else {
            break;
        }
    }

    lastError = errno;
    return false;
}